

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaDestroyImage(VmaAllocator allocator,VkImage image,VmaAllocation allocation)

{
  PFN_vkDestroyImage p_Var1;
  VkDevice pVVar2;
  VmaVulkanFunctions *pVVar3;
  VkAllocationCallbacks *pVVar4;
  long in_RDX;
  VkImage in_RSI;
  VmaAllocator_T *in_RDI;
  VmaAllocation *unaff_retaddr;
  size_t in_stack_00000008;
  VmaAllocator_T *in_stack_00000010;
  
  if ((in_RSI != (VkImage)0x0) || (in_RDX != 0)) {
    if (in_RSI != (VkImage)0x0) {
      pVVar3 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
      p_Var1 = pVVar3->vkDestroyImage;
      pVVar2 = in_RDI->m_hDevice;
      pVVar4 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
      (*p_Var1)(pVVar2,in_RSI,pVVar4);
    }
    if (in_RDX != 0) {
      VmaAllocator_T::FreeMemory(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyImage(
    VmaAllocator VMA_NOT_NULL allocator,
    VkImage VMA_NULLABLE_NON_DISPATCHABLE image,
    VmaAllocation VMA_NULLABLE allocation)
{
    VMA_ASSERT(allocator);

    if(image == VK_NULL_HANDLE && allocation == VK_NULL_HANDLE)
    {
        return;
    }

    VMA_DEBUG_LOG("vmaDestroyImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if(image != VK_NULL_HANDLE)
    {
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, image, allocator->GetAllocationCallbacks());
    }
    if(allocation != VK_NULL_HANDLE)
    {
        allocator->FreeMemory(
            1, // allocationCount
            &allocation);
    }
}